

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O3

ArticulatedBodyInertia *
iDynTree::ArticulatedBodyInertia::ABADyadHelper
          (ArticulatedBodyInertia *__return_storage_ptr__,SpatialForceVector *U,double d)

{
  double dVar1;
  SpatialVector<iDynTree::SpatialForceVector> *pSVar2;
  AngularVector3T *pAVar3;
  long lVar4;
  AngularVector3T *pAVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  type tmp;
  double adStack_70 [4];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  adStack_70[0] = 5.86694061254855e-318;
  local_18 = d;
  ArticulatedBodyInertia(__return_storage_ptr__);
  dVar6 = 1.0 / local_18;
  pSVar2 = &U->super_SpatialVector<iDynTree::SpatialForceVector>;
  dVar7 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[0]
          * dVar6;
  dVar8 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[1]
          * dVar6;
  dVar9 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[2]
          * dVar6;
  lVar4 = 2;
  do {
    dVar1 = (pSVar2->linearVec3).super_Vector3.m_data[0];
    adStack_70[lVar4] = dVar1 * dVar7;
    adStack_70[lVar4 + 1] = dVar1 * dVar8;
    adStack_70[lVar4 + 2] = dVar1 * dVar9;
    lVar4 = lVar4 + 3;
    pSVar2 = (SpatialVector<iDynTree::SpatialForceVector> *)
             ((pSVar2->linearVec3).super_Vector3.m_data + 1);
  } while (lVar4 != 0xb);
  pAVar3 = &(U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3;
  (__return_storage_ptr__->linearLinear).m_data[0] = adStack_70[2];
  (__return_storage_ptr__->linearLinear).m_data[1] = local_48;
  (__return_storage_ptr__->linearLinear).m_data[2] = local_30;
  (__return_storage_ptr__->linearLinear).m_data[3] = adStack_70[3];
  (__return_storage_ptr__->linearLinear).m_data[4] = local_40;
  (__return_storage_ptr__->linearLinear).m_data[5] = local_28;
  (__return_storage_ptr__->linearLinear).m_data[6] = local_50;
  (__return_storage_ptr__->linearLinear).m_data[7] = local_38;
  (__return_storage_ptr__->linearLinear).m_data[8] = local_20;
  lVar4 = 2;
  pAVar5 = pAVar3;
  do {
    dVar1 = (pAVar5->super_Vector3).m_data[0];
    adStack_70[lVar4] = dVar1 * dVar7;
    adStack_70[lVar4 + 1] = dVar1 * dVar8;
    adStack_70[lVar4 + 2] = dVar1 * dVar9;
    lVar4 = lVar4 + 3;
    pAVar5 = (AngularVector3T *)((pAVar5->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  (__return_storage_ptr__->linearAngular).m_data[0] = adStack_70[2];
  (__return_storage_ptr__->linearAngular).m_data[1] = local_48;
  (__return_storage_ptr__->linearAngular).m_data[2] = local_30;
  (__return_storage_ptr__->linearAngular).m_data[3] = adStack_70[3];
  (__return_storage_ptr__->linearAngular).m_data[4] = local_40;
  (__return_storage_ptr__->linearAngular).m_data[5] = local_28;
  (__return_storage_ptr__->linearAngular).m_data[6] = local_50;
  (__return_storage_ptr__->linearAngular).m_data[7] = local_38;
  (__return_storage_ptr__->linearAngular).m_data[8] = local_20;
  dVar8 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[0]
  ;
  dVar9 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[1]
  ;
  dVar7 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[2]
  ;
  lVar4 = 2;
  do {
    dVar1 = (pAVar3->super_Vector3).m_data[0];
    adStack_70[lVar4] = dVar1 * dVar6 * dVar8;
    adStack_70[lVar4 + 1] = dVar1 * dVar6 * dVar9;
    adStack_70[lVar4 + 2] = dVar1 * dVar6 * dVar7;
    lVar4 = lVar4 + 3;
    pAVar3 = (AngularVector3T *)((pAVar3->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  (__return_storage_ptr__->angularAngular).m_data[0] = adStack_70[2];
  (__return_storage_ptr__->angularAngular).m_data[1] = local_48;
  (__return_storage_ptr__->angularAngular).m_data[2] = local_30;
  (__return_storage_ptr__->angularAngular).m_data[3] = adStack_70[3];
  (__return_storage_ptr__->angularAngular).m_data[4] = local_40;
  (__return_storage_ptr__->angularAngular).m_data[5] = local_28;
  (__return_storage_ptr__->angularAngular).m_data[6] = local_50;
  (__return_storage_ptr__->angularAngular).m_data[7] = local_38;
  (__return_storage_ptr__->angularAngular).m_data[8] = local_20;
  return __return_storage_ptr__;
}

Assistant:

ArticulatedBodyInertia ArticulatedBodyInertia::ABADyadHelper(const SpatialForceVector& U, const double d)
{
    ArticulatedBodyInertia ret;

    double inv_d = 1.0/d;

    Eigen::Map<const Eigen::Vector3d> Ulin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> Uang(U.getAngularVec3().data());

    toEigen(ret.getLinearLinearSubmatrix()) = (inv_d*Ulin)*Ulin.transpose();
    toEigen(ret.getLinearAngularSubmatrix()) = (inv_d*Ulin)*Uang.transpose();
    toEigen(ret.getAngularAngularSubmatrix()) = (inv_d*Uang)*Uang.transpose();

    return ret;
}